

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O1

void __thiscall Imf_2_5::B44Compressor::~B44Compressor(B44Compressor *this)

{
  ~B44Compressor(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

B44Compressor::~B44Compressor ()
{
    delete [] _tmpBuffer;
    delete [] _outBuffer;
    delete [] _channelData;
}